

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper.cpp
# Opt level: O0

void __thiscall cppcms::url_mapper::set_value(url_mapper *this,string *key,string *value)

{
  url_mapper *this_00;
  data *pdVar1;
  mapped_type *this_01;
  string *in_RDX;
  key_type *in_stack_ffffffffffffffc8;
  map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  this_00 = root_mapper((url_mapper *)in_RDX);
  pdVar1 = booster::hold_ptr<cppcms::url_mapper::data>::operator->(&this_00->d);
  string_key::string_key((string_key *)&pdVar1->helpers,in_RDX);
  this_01 = std::
            map<cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::operator=((string *)this_01,(string *)in_RDX);
  string_key::~string_key((string_key *)0x3bb6cb);
  return;
}

Assistant:

void url_mapper::set_value(std::string const &key,std::string const &value)
	{
		root_mapper()->d->helpers[key]=value;
	}